

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope_success_example.cpp
# Opt level: O1

int main(void)

{
  char cVar1;
  int iVar2;
  runtime_error *this;
  scope_success<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Neargye[P]scope_guard_example_scope_success_example_cpp:65:3)>
  NEARGYE_SCOPE_SUCCESS_2;
  fstream file;
  char local_238 [16];
  long local_228 [64];
  
  std::fstream::fstream(local_238);
  std::fstream::open(local_238,0x102004);
  std::uncaught_exceptions();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[1] inside WITH_SCOPE_SUCCESS",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  iVar2 = std::uncaught_exceptions();
  if (iVar2 != -1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[1] leave WITH_SCOPE_SUCCESS",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"example",7);
  cVar1 = (char)(ostream *)local_228;
  std::ios::widen((char)*(undefined8 *)(local_228[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[1] write to file",0x11)
  ;
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::fstream::close();
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"error");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main() {
  try {
    std::fstream file;
    file.open("test.txt", std::fstream::out | std::fstream::trunc);
    SCOPE_SUCCESS{
      file.close();
      std::cout << "[1] file write success" << std::endl;
    };

    MAKE_SCOPE_SUCCESS(scope_success_1) {
      std::cout << "[1] file write success" << std::endl;
    };

    auto scope_success_2 = scope_guard::make_scope_success([&]() {
      std::cout << "[1] file write success" << std::endl;
    });

    WITH_SCOPE_SUCCESS({ std::cout << "[1] leave WITH_SCOPE_SUCCESS" << std::endl; }) {
      std::cout << "[1] inside WITH_SCOPE_SUCCESS" << std::endl;
    }

    file << "example" << std::endl;
    std::cout << "[1] write to file" << std::endl;
    file.close();

    scope_success_1.dismiss();

    throw std::runtime_error{"error"};

    scope_success_2.dismiss();
  }